

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O2

void av1_cyclic_refresh_update_segment
               (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,int64_t rate,
               int64_t dist,int skip,RUN_TYPE dry_run)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  MB_MODE_INFO *pMVar5;
  CYCLIC_REFRESH *pCVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  undefined7 in_register_00000081;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  size_t __n;
  
  uVar15 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  iVar4 = (cpi->common).mi_params.mi_cols;
  uVar18 = iVar4 - mi_col;
  if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [uVar15] <= (int)uVar18) {
    uVar18 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar15];
  }
  uVar12 = (cpi->common).mi_params.mi_rows - mi_row;
  if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [uVar15] <= (int)uVar12) {
    uVar12 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [uVar15];
  }
  pMVar5 = *(x->e_mbd).mi;
  if ((cpi->noise_estimate).enabled == 0) {
    bVar7 = true;
  }
  else {
    bVar7 = (int)(cpi->noise_estimate).level < 2;
  }
  pCVar6 = cpi->cyclic_refresh;
  if (pMVar5->ref_frame[1] < '\x01') {
    if (pCVar6->thresh_dist_sb < dist) {
      sVar2 = pMVar5->mv[0].as_mv.row;
      sVar3 = pCVar6->motion_thresh;
      iVar17 = (int)sVar3;
      bVar7 = true;
      if (sVar2 <= sVar3) {
        uVar13 = 0;
        if (((SBORROW4((int)sVar2,-iVar17) != sVar2 + iVar17 < 0) ||
            (sVar2 = pMVar5->mv[0].as_mv.col, sVar3 < sVar2)) ||
           (SBORROW4((int)sVar2,-iVar17) != sVar2 + iVar17 < 0)) goto LAB_003494ee;
        if (((pMVar5->field_0xa7 & 0x80) != 0) || ('\0' < pMVar5->ref_frame[0])) goto LAB_003494be;
      }
      uVar13 = 0;
      goto LAB_003494ee;
    }
LAB_003494be:
    if ((((BLOCK_16X8 < bsize) && (rate < pCVar6->thresh_rate_sb)) &&
        (((pMVar5->field_0xa7 & 0x80) != 0 || ('\0' < pMVar5->ref_frame[0])))) &&
       ((pMVar5->mv[0].as_int == 0 && (10 < pCVar6->rate_boost_fac)))) goto LAB_00349469;
    uVar13 = 1;
  }
  else {
    if (!bVar7) goto LAB_003494be;
LAB_00349469:
    uVar13 = 2;
  }
  bVar7 = false;
LAB_003494ee:
  lVar14 = 2 - (ulong)(pCVar6->skip_over4x4 == 0);
  lVar11 = (long)(iVar4 * mi_row + mi_col);
  bVar1 = pCVar6->map[lVar11];
  uVar10 = (uint)*(ushort *)&pMVar5->field_0xa7;
  if (0xfffffffd < (uVar10 & 7) - 3) {
    if (skip != 0) {
      uVar13 = 0;
    }
    uVar10 = uVar13 | *(ushort *)&pMVar5->field_0xa7 & 0xfffffff8;
    *(short *)&pMVar5->field_0xa7 = (short)uVar10;
  }
  bVar8 = (byte)uVar10 & 7;
  if ((uVar10 & 7) - 3 < 0xfffffffe) {
    bVar9 = 1;
    if ((!bVar7) && (bVar9 = bVar1, pCVar6->map[lVar11] == '\x01')) {
      bVar9 = 0;
    }
  }
  else {
    bVar9 = -(char)pCVar6->time_for_refresh;
  }
  iVar4 = (cpi->common).mi_params.mi_cols;
  __n = (size_t)(int)uVar18;
  uVar13 = (uint)bVar8;
  for (lVar16 = 0; lVar16 < (int)uVar12; lVar16 = lVar16 + lVar14) {
    memset(pCVar6->map + lVar11,(uint)bVar9,__n);
    memset((cpi->enc_seg).map + lVar11,uVar13,__n);
    memset(((cpi->common).cur_frame)->seg_map + lVar11,uVar13,__n);
    lVar11 = lVar11 + iVar4 * lVar14;
  }
  if (dry_run == '\0') {
    if (bVar8 == 2) {
      x->actual_num_seg2_blocks = x->actual_num_seg2_blocks + uVar12 * uVar18;
    }
    else if (uVar13 == 1) {
      x->actual_num_seg1_blocks = x->actual_num_seg1_blocks + uVar12 * uVar18;
    }
  }
  return;
}

Assistant:

void av1_cyclic_refresh_update_segment(const AV1_COMP *cpi, MACROBLOCK *const x,
                                       int mi_row, int mi_col, BLOCK_SIZE bsize,
                                       int64_t rate, int64_t dist, int skip,
                                       RUN_TYPE dry_run) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int xmis = AOMMIN(cm->mi_params.mi_cols - mi_col, bw);
  const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, bh);
  const int block_index = mi_row * cm->mi_params.mi_cols + mi_col;
  int noise_level = 0;
  if (cpi->noise_estimate.enabled) noise_level = cpi->noise_estimate.level;
  const int refresh_this_block =
      candidate_refresh_aq(cr, mbmi, rate, dist, bsize, noise_level);
  int sh = cpi->cyclic_refresh->skip_over4x4 ? 2 : 1;
  // Default is to not update the refresh map.
  int new_map_value = cr->map[block_index];

  // If this block is labeled for refresh, check if we should reset the
  // segment_id.
  if (cyclic_refresh_segment_id_boosted(mbmi->segment_id)) {
    mbmi->segment_id = refresh_this_block;
    // Reset segment_id if will be skipped.
    if (skip) mbmi->segment_id = CR_SEGMENT_ID_BASE;
  }
  const uint8_t segment_id = mbmi->segment_id;

  // Update the cyclic refresh map, to be used for setting segmentation map
  // for the next frame. If the block  will be refreshed this frame, mark it
  // as clean. The magnitude of the -ve influences how long before we consider
  // it for refresh again.
  if (cyclic_refresh_segment_id_boosted(segment_id)) {
    new_map_value = -cr->time_for_refresh;
  } else if (refresh_this_block) {
    // Else if it is accepted as candidate for refresh, and has not already
    // been refreshed (marked as 1) then mark it as a candidate for cleanup
    // for future time (marked as 0), otherwise don't update it.
    if (cr->map[block_index] == 1) new_map_value = 0;
  } else {
    // Leave it marked as block that is not candidate for refresh.
    new_map_value = 1;
  }

  // Update entries in the cyclic refresh map with new_map_value, and
  // copy mbmi->segment_id into global segmentation map.
  const int mi_stride = cm->mi_params.mi_cols;
  for (int mi_y = 0; mi_y < ymis; mi_y += sh) {
    const int map_offset = block_index + mi_y * mi_stride;
    memset(&cr->map[map_offset], new_map_value, xmis);
    memset(&cpi->enc_seg.map[map_offset], segment_id, xmis);
    memset(&cm->cur_frame->seg_map[map_offset], segment_id, xmis);
  }

  // Accumulate cyclic refresh update counters.
  if (!dry_run) {
    if (cyclic_refresh_segment_id(segment_id) == CR_SEGMENT_ID_BOOST1)
      x->actual_num_seg1_blocks += xmis * ymis;
    else if (cyclic_refresh_segment_id(segment_id) == CR_SEGMENT_ID_BOOST2)
      x->actual_num_seg2_blocks += xmis * ymis;
  }
}